

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
re2::Prog::MarkRoots
          (Prog *this,SparseArray<int> *rootmap,SparseSet *q,vector<int,_std::allocator<int>_> *stk)

{
  int iVar1;
  Inst *pIVar2;
  bool bVar3;
  uint i;
  uint i_00;
  iterator iVar5;
  pointer piVar6;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_38;
  int local_34;
  uint uVar4;
  
  SparseArray<int>::set_new(rootmap,0,rootmap->size_);
  iVar1 = this->start_unanchored_;
  if ((long)iVar1 < 0) {
LAB_00122cd0:
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x134,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  if (iVar1 < rootmap->max_size_) {
    if (((uint)rootmap->size_ <= (uint)rootmap->sparse_to_dense_[iVar1]) ||
       ((rootmap->dense_).
        super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
        ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[iVar1]].index_ != iVar1)
       ) {
      SparseArray<int>::set_new(rootmap,iVar1,rootmap->size_);
    }
    iVar1 = this->start_;
    if ((long)iVar1 < 0) goto LAB_00122cd0;
    if (iVar1 < rootmap->max_size_) {
      if (((uint)rootmap->size_ <= (uint)rootmap->sparse_to_dense_[iVar1]) ||
         ((rootmap->dense_).
          super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
          ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[iVar1]].index_ !=
          iVar1)) {
        SparseArray<int>::set_new(rootmap,iVar1,rootmap->size_);
      }
      q->size_ = 0;
      piVar6 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      iVar5._M_current =
           (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar5._M_current != piVar6) {
        (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar6;
        iVar5._M_current = piVar6;
      }
      local_34 = this->start_unanchored_;
      if (iVar5._M_current ==
          (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar5,&local_34);
        piVar6 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *iVar5._M_current = local_34;
        piVar6 = iVar5._M_current + 1;
        (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar6;
      }
      if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start != piVar6) {
        do {
          i = piVar6[-1];
          (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = piVar6 + -1;
          while (bVar3 = SparseSet::contains(q,i), !bVar3) {
            SparseSet::insert_new(q,i);
            pIVar2 = this->inst_;
            uVar4 = pIVar2[(int)i].out_opcode_;
            switch(uVar4 & 7) {
            case 0:
            case 1:
              if ((uVar4 & 6) != 0) {
                __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                              "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                              ,0x6d,"int re2::Prog::Inst::out1()");
              }
              local_38 = pIVar2[(int)i].field_1;
              iVar5._M_current =
                   (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (stk,iVar5,&local_38.cap_);
              }
              else {
                *iVar5._M_current = (int)local_38;
                (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish = iVar5._M_current + 1;
              }
LAB_00122c66:
              uVar4 = pIVar2[(int)i].out_opcode_;
              break;
            default:
              i_00 = uVar4 >> 4;
              if (rootmap->max_size_ <= (int)i_00) goto LAB_00122c92;
              if (((uint)rootmap->size_ <= (uint)rootmap->sparse_to_dense_[i_00]) ||
                 ((rootmap->dense_).
                  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                  ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[i_00]].index_
                  != i_00)) {
                SparseArray<int>::set_new(rootmap,i_00,rootmap->size_);
                goto LAB_00122c66;
              }
              break;
            case 5:
            case 7:
              goto switchD_00122bff_caseD_5;
            case 6:
              break;
            }
            i = uVar4 >> 4;
          }
switchD_00122bff_caseD_5:
          piVar6 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        } while ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start != piVar6);
      }
      return;
    }
  }
LAB_00122c92:
  __assert_fail("(i) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
}

Assistant:

void Prog::MarkRoots(SparseArray<int>* rootmap,
                     SparseSet* q, vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  q->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction.
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}